

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::~bufferCollection(bufferCollection *this)

{
  pointer ppVar1;
  Buffer *this_00;
  pointer ppVar2;
  
  ppVar2 = (this->m_vector).
           super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->m_vector).
           super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    do {
      this_00 = ppVar2->m_buffer;
      if (this_00 != (Buffer *)0x0) {
        Utils::Buffer::~Buffer(this_00);
        operator_delete(this_00,0x10);
        ppVar2->m_buffer = (Buffer *)0x0;
      }
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar1);
    ppVar2 = (this->m_vector).
             super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2,(long)(this->m_vector).
                                 super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2);
    return;
  }
  return;
}

Assistant:

BufferTestBase::bufferCollection::~bufferCollection()
{
	for (Vector::iterator it = m_vector.begin(), end = m_vector.end(); end != it; ++it)
	{
		if (0 != it->m_buffer)
		{
			delete it->m_buffer;
			it->m_buffer = 0;
		}
	}
}